

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KRef_Ptr.h
# Opt level: O1

KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> * __thiscall
KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::operator=
          (KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *this,
          KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *p)

{
  StandardVariable *pSVar1;
  RefCounter *pRVar2;
  
  if (this->m_pRef != p->m_pRef) {
    unRef(this);
    pSVar1 = p->m_pRef;
    this->m_pRef = pSVar1;
    pRVar2 = p->m_piCount;
    this->m_piCount = pRVar2;
    if (pSVar1 != (StandardVariable *)0x0) {
      *pRVar2 = *pRVar2 + 1;
    }
  }
  return this;
}

Assistant:

KRef_Ptr<Type> & operator=( const KRef_Ptr<Type> & p )
    {
        if( m_pRef == p.m_pRef )return *this;
        unRef();
        m_pRef = p.m_pRef;
        m_piCount = p.m_piCount;
        ref();
        return *this;
    }